

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestRunTest.cxx
# Opt level: O0

void __thiscall cmCTestRunTest::StartFailure(cmCTestRunTest *this,string *output,string *detail)

{
  cmCTest *pcVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  char *pcVar5;
  ulong uVar6;
  duration<double,_std::ratio<1L,_1L>_> dVar7;
  string local_368 [32];
  ostringstream local_348 [8];
  ostringstream cmCTestLog_msg_1;
  string local_1d0 [32];
  int local_1b0;
  int local_19c;
  undefined1 local_198 [8];
  ostringstream cmCTestLog_msg;
  string *detail_local;
  string *output_local;
  cmCTestRunTest *this_local;
  
  bVar2 = cmCTest::GetTestProgressOutput(this->CTest);
  if (!bVar2) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
    iVar3 = getNumWidth(this->TotalNumberOfTests);
    local_19c = (int)std::setw(iVar3 * 2 + 8);
    poVar4 = std::operator<<((ostream *)local_198,(_Setw)local_19c);
    poVar4 = std::operator<<(poVar4,"Start ");
    iVar3 = cmCTestTestHandler::GetMaxIndex(this->TestHandler);
    iVar3 = getNumWidth((long)iVar3);
    local_1b0 = (int)std::setw(iVar3);
    poVar4 = std::operator<<(poVar4,(_Setw)local_1b0);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,this->TestProperties->Index);
    poVar4 = std::operator<<(poVar4,": ");
    poVar4 = std::operator<<(poVar4,(string *)this->TestProperties);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    pcVar1 = this->CTest;
    std::__cxx11::ostringstream::str();
    pcVar5 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(pcVar1,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                 ,0x1c6,pcVar5,false);
    std::__cxx11::string::~string(local_1d0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
  }
  std::__cxx11::string::clear();
  uVar6 = std::__cxx11::string::empty();
  if ((uVar6 & 1) == 0) {
    poVar4 = std::operator<<(this->TestHandler->LogFile,(string *)output);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::__cxx11::ostringstream::ostringstream(local_348);
    poVar4 = std::operator<<((ostream *)local_348,(string *)output);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    pcVar1 = this->CTest;
    std::__cxx11::ostringstream::str();
    pcVar5 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(pcVar1,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                 ,0x1cc,pcVar5,false);
    std::__cxx11::string::~string(local_368);
    std::__cxx11::ostringstream::~ostringstream(local_348);
  }
  (this->TestResult).Properties = this->TestProperties;
  dVar7 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::zero();
  (this->TestResult).ExecutionTime.__r = dVar7.__r;
  (this->TestResult).CompressOutput = false;
  (this->TestResult).ReturnValue = -1;
  std::__cxx11::string::operator=((string *)&(this->TestResult).CompletionStatus,(string *)detail);
  (this->TestResult).Status = 0;
  (this->TestResult).TestCount = this->TestProperties->Index;
  std::__cxx11::string::operator=((string *)&this->TestResult,(string *)this->TestProperties);
  std::__cxx11::string::operator=
            ((string *)&(this->TestResult).Path,(string *)&this->TestProperties->Directory);
  std::__cxx11::string::operator=((string *)&(this->TestResult).Output,(string *)output);
  std::__cxx11::string::clear();
  std::__cxx11::string::clear();
  return;
}

Assistant:

void cmCTestRunTest::StartFailure(std::string const& output,
                                  std::string const& detail)
{
  // Still need to log the Start message so the test summary records our
  // attempt to start this test
  if (!this->CTest->GetTestProgressOutput()) {
    cmCTestLog(this->CTest, HANDLER_OUTPUT,
               std::setw(2 * getNumWidth(this->TotalNumberOfTests) + 8)
                 << "Start "
                 << std::setw(getNumWidth(this->TestHandler->GetMaxIndex()))
                 << this->TestProperties->Index << ": "
                 << this->TestProperties->Name << std::endl);
  }

  this->ProcessOutput.clear();
  if (!output.empty()) {
    *this->TestHandler->LogFile << output << std::endl;
    cmCTestLog(this->CTest, ERROR_MESSAGE, output << std::endl);
  }

  this->TestResult.Properties = this->TestProperties;
  this->TestResult.ExecutionTime = cmDuration::zero();
  this->TestResult.CompressOutput = false;
  this->TestResult.ReturnValue = -1;
  this->TestResult.CompletionStatus = detail;
  this->TestResult.Status = cmCTestTestHandler::NOT_RUN;
  this->TestResult.TestCount = this->TestProperties->Index;
  this->TestResult.Name = this->TestProperties->Name;
  this->TestResult.Path = this->TestProperties->Directory;
  this->TestResult.Output = output;
  this->TestResult.FullCommandLine.clear();
  this->TestResult.Environment.clear();
}